

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection_p.h
# Opt level: O0

QByteDataBuffer * __thiscall QHttp2Stream::takeDownloadBuffer(QHttp2Stream *this)

{
  long lVar1;
  QByteDataBuffer *__obj;
  long in_RSI;
  QByteDataBuffer *in_RDI;
  long in_FS_OFFSET;
  QByteDataBuffer *__new_val;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __obj = (QByteDataBuffer *)(in_RSI + 0x40);
  __new_val = in_RDI;
  QByteDataBuffer::QByteDataBuffer(in_RDI);
  std::exchange<QByteDataBuffer,QByteDataBuffer>(__obj,__new_val);
  QByteDataBuffer::~QByteDataBuffer((QByteDataBuffer *)0x2d69fd);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteDataBuffer takeDownloadBuffer() noexcept { return std::exchange(m_downloadBuffer, {}); }